

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int psbt_combine(wally_psbt *psbt,wally_psbt *src)

{
  bool bVar1;
  int local_24;
  ulong uStack_20;
  int ret;
  size_t i;
  wally_psbt *src_local;
  wally_psbt *psbt_local;
  
  local_24 = 0;
  uStack_20 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 == 0) {
      bVar1 = uStack_20 < psbt->num_inputs;
    }
    if (!bVar1) break;
    local_24 = combine_inputs(psbt->inputs + uStack_20,src->inputs + uStack_20);
    uStack_20 = uStack_20 + 1;
  }
  uStack_20 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 == 0) {
      bVar1 = uStack_20 < psbt->num_outputs;
    }
    if (!bVar1) break;
    local_24 = combine_outputs(psbt->outputs + uStack_20,src->outputs + uStack_20);
    uStack_20 = uStack_20 + 1;
  }
  if (local_24 == 0) {
    local_24 = map_extend(&psbt->unknowns,&src->unknowns,(_func_int_uchar_ptr_size_t *)0x0);
  }
  return local_24;
}

Assistant:

static int psbt_combine(struct wally_psbt *psbt, const struct wally_psbt *src)
{
    size_t i;
    int ret = WALLY_OK;

    for (i = 0; ret == WALLY_OK && i < psbt->num_inputs; ++i)
        ret = combine_inputs(&psbt->inputs[i], &src->inputs[i]);

    for (i = 0; ret == WALLY_OK && i < psbt->num_outputs; ++i)
        ret = combine_outputs(&psbt->outputs[i], &src->outputs[i]);

    if (ret == WALLY_OK)
        ret = map_extend(&psbt->unknowns, &src->unknowns, NULL);

    return ret;
}